

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,int require_null_terminated)

{
  cJSON *item;
  char *pcVar1;
  char **ep;
  
  ep = &global_ep;
  if (return_parse_end != (char **)0x0) {
    ep = return_parse_end;
  }
  item = (cJSON *)(*cJSON_malloc)(0x40);
  if (item == (cJSON *)0x0) {
    *ep = (char *)0x0;
  }
  else {
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    *ep = (char *)0x0;
    pcVar1 = skip(value);
    pcVar1 = parse_value(item,pcVar1,ep);
    if (pcVar1 == (char *)0x0) {
      cJSON_Delete(item);
    }
    else {
      if ((require_null_terminated == 0) || (pcVar1 = skip(pcVar1), *pcVar1 == '\0')) {
        if (return_parse_end == (char **)0x0) {
          return item;
        }
        *return_parse_end = pcVar1;
        return item;
      }
      cJSON_Delete(item);
      *ep = pcVar1;
    }
  }
  return (cJSON *)0x0;
}

Assistant:

cJSON *cJSON_ParseWithOpts(const char *value,const char **return_parse_end,int require_null_terminated)
{
	const char *end=0,**ep=return_parse_end?return_parse_end:&global_ep;
	cJSON *c=cJSON_New_Item();
	*ep=0;
	if (!c) return 0;       /* memory fail */

	end=parse_value(c,skip(value),ep);
	if (!end)	{cJSON_Delete(c);return 0;}	/* parse failure. ep is set. */

	/* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
	if (require_null_terminated) {end=skip(end);if (*end) {cJSON_Delete(c);*ep=end;return 0;}}
	if (return_parse_end) *return_parse_end=end;
	return c;
}